

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManGraphHashEdge(Nwk_Grf_t *p,int iLut1,int iLut2)

{
  Nwk_Edg_t **ppNVar1;
  ulong uVar2;
  Nwk_Edg_t *pNVar3;
  int iVar4;
  
  if (iLut1 != iLut2) {
    iVar4 = iLut2;
    if (iLut1 < iLut2) {
      iVar4 = iLut1;
    }
    if (iLut2 < iLut1) {
      iLut2 = iLut1;
    }
    if (iLut2 <= iVar4) {
      __assert_fail("iLut1 < iLut2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                    ,0x83,"void Nwk_ManGraphHashEdge(Nwk_Grf_t *, int, int)");
    }
    if (p->nObjs < iLut2) {
      p->nObjs = iLut2;
    }
    uVar2 = (ulong)(uint)(iLut2 * 0x40f1f9 + iVar4 * 0xb5051) % (ulong)(uint)p->nEdgeHash;
    for (pNVar3 = p->pEdgeHash[uVar2]; pNVar3 != (Nwk_Edg_t *)0x0; pNVar3 = pNVar3->pNext) {
      if ((pNVar3->iNode1 == iVar4) && (pNVar3->iNode2 == iLut2)) {
        return;
      }
    }
    pNVar3 = (Nwk_Edg_t *)Aig_MmFixedEntryFetch(p->pMemEdges);
    pNVar3->iNode1 = iVar4;
    pNVar3->iNode2 = iLut2;
    ppNVar1 = p->pEdgeHash;
    pNVar3->pNext = ppNVar1[uVar2];
    ppNVar1[uVar2] = pNVar3;
    p->nEdges = p->nEdges + 1;
  }
  return;
}

Assistant:

void Nwk_ManGraphHashEdge( Nwk_Grf_t * p, int iLut1, int iLut2 )
{
    Nwk_Edg_t * pEntry;
    unsigned Key;
    if ( iLut1 == iLut2 )
        return;
    if ( iLut1 > iLut2 )
    {
        Key = iLut1;
        iLut1 = iLut2;
        iLut2 = Key;
    }
    assert( iLut1 < iLut2 );
    if ( p->nObjs < iLut2 )
        p->nObjs = iLut2;
    Key = (unsigned)(741457 * iLut1 + 4256249 * iLut2) % p->nEdgeHash;
    for ( pEntry = p->pEdgeHash[Key]; pEntry; pEntry = pEntry->pNext )
        if ( pEntry->iNode1 == iLut1 && pEntry->iNode2 == iLut2 )
            return;
    pEntry = (Nwk_Edg_t *)Aig_MmFixedEntryFetch( p->pMemEdges );
    pEntry->iNode1 = iLut1;
    pEntry->iNode2 = iLut2;
    pEntry->pNext = p->pEdgeHash[Key];
    p->pEdgeHash[Key] = pEntry;
    p->nEdges++;
}